

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbuffer.c
# Opt level: O1

void bounded_buffer_init(bounded_buffer_t *bb,int size)

{
  entry_t **ppeVar1;
  ulong uVar2;
  
  ppeVar1 = (entry_t **)malloc((long)size * 8);
  bb->entries = ppeVar1;
  if (0 < size) {
    uVar2 = 0;
    do {
      bb->entries[uVar2] = (entry_t *)0x0;
      uVar2 = uVar2 + 1;
    } while ((uint)size != uVar2);
  }
  bb->size = size;
  bb->head = 0;
  bb->tail = 0;
  pthread_mutex_init((pthread_mutex_t *)&bb->lock,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&bb->has_space,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&bb->has_items,(pthread_condattr_t *)0x0);
  return;
}

Assistant:

void bounded_buffer_init(bounded_buffer_t* bb, int size)
{
    bb->entries = (entry_t**) malloc(size * sizeof(entry_t*));
    for (int i=0; i < size; i++)
        bb->entries[i] = NULL;
    bb->size = size;
    bb->head = bb->tail = 0;
    pthread_mutex_init(&bb->lock, NULL);
    pthread_cond_init (&bb->has_space, NULL);
    pthread_cond_init (&bb->has_items, NULL);
}